

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::CommandLineInterface(CommandLineInterface *this)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_59 [41];
  
  (this->executable_name_)._M_dataplus._M_p = (pointer)&(this->executable_name_).field_2;
  (this->executable_name_)._M_string_length = 0;
  (this->executable_name_).field_2._M_local_buf[0] = '\0';
  (this->version_info_)._M_dataplus._M_p = (pointer)&(this->version_info_).field_2;
  (this->version_info_)._M_string_length = 0;
  (this->version_info_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header;
  (this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->generators_by_option_name_)._M_t._M_impl.super__Rb_tree_header;
  (this->generators_by_option_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->generators_by_option_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->generators_by_option_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->generators_by_option_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->generators_by_option_name_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->generator_parameters_)._M_t._M_impl.super__Rb_tree_header;
  (this->generator_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->generator_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->generator_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->generator_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->generator_parameters_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  p_Var1 = &(this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header;
  (this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->plugin_prefix_)._M_dataplus._M_p = (pointer)&(this->plugin_prefix_).field_2;
  (this->plugin_prefix_)._M_string_length = 0;
  (this->plugin_prefix_).field_2._M_local_buf[0] = '\0';
  (this->plugins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->plugins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->plugins_)._M_t._M_impl.super__Rb_tree_header;
  (this->plugins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->plugins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header;
  (this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->plugins_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mode_ = MODE_COMPILE;
  this->print_mode_ = PRINT_NONE;
  this->error_format_ = ERROR_FORMAT_GCC;
  (this->input_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->input_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->proto_path_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->input_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->proto_path_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->proto_path_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->direct_dependencies_explicitly_set_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->direct_dependencies_violation_msg_,
             "File is imported but not declared in --direct_dependencies: %s",local_59);
  (this->output_directives_).
  super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output_directives_).
  super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output_directives_).
  super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->codec_type_)._M_dataplus._M_p = (pointer)&(this->codec_type_).field_2;
  (this->codec_type_)._M_string_length = 0;
  (this->codec_type_).field_2._M_local_buf[0] = '\0';
  (this->descriptor_set_name_)._M_dataplus._M_p = (pointer)&(this->descriptor_set_name_).field_2;
  (this->descriptor_set_name_)._M_string_length = 0;
  (this->descriptor_set_name_).field_2._M_local_buf[0] = '\0';
  (this->dependency_out_name_)._M_dataplus._M_p = (pointer)&(this->dependency_out_name_).field_2;
  (this->dependency_out_name_)._M_string_length = 0;
  (this->dependency_out_name_).field_2._M_local_buf[0] = '\0';
  (this->profile_path_)._M_dataplus._M_p = (pointer)&(this->profile_path_).field_2;
  (this->profile_path_)._M_string_length = 0;
  (this->profile_path_).field_2._M_local_buf[0] = '\0';
  this->imports_in_descriptor_set_ = false;
  this->source_info_in_descriptor_set_ = false;
  this->disallow_services_ = false;
  this->inputs_are_proto_path_relative_ = false;
  return;
}

Assistant:

CommandLineInterface::CommandLineInterface()
    : mode_(MODE_COMPILE),
      print_mode_(PRINT_NONE),
      error_format_(ERROR_FORMAT_GCC),
      direct_dependencies_explicitly_set_(false),
      direct_dependencies_violation_msg_(
          kDefaultDirectDependenciesViolationMsg),
      imports_in_descriptor_set_(false),
      source_info_in_descriptor_set_(false),
      disallow_services_(false),
      inputs_are_proto_path_relative_(false) {
}